

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas-calc.c
# Opt level: O2

int parse_calculation_line(char *line,char *full_line)

{
  byte *s;
  void **ppvVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  void **ppvVar5;
  ulong uVar6;
  bool bVar7;
  _Bool not;
  _Bool _Var8;
  int iVar9;
  borg_calculation *f;
  borg_array *pbVar10;
  ushort **ppuVar11;
  char *pcVar12;
  undefined4 *token;
  size_t sVar13;
  value_sec *p;
  token *ptVar14;
  int iVar15;
  ulong uVar16;
  int pdepth;
  long lVar17;
  byte *pbVar18;
  byte *pbVar19;
  token_type ttype;
  byte *pbVar20;
  ulong uVar21;
  bool bVar22;
  char *local_450;
  char local_438 [1032];
  
  f = (borg_calculation *)mem_zalloc(0x10);
  pbVar10 = (borg_array *)mem_zalloc(0x10);
  f->token_array = pbVar10;
  iVar15 = 0;
  local_450 = "** unmatched parenthesis";
  not = false;
  bVar7 = false;
  pbVar19 = (byte *)line;
LAB_002114f8:
  do {
    pbVar20 = pbVar19 + -1;
    lVar17 = 0;
LAB_002114ff:
    if (pbVar19[lVar17] == 0) {
LAB_00211888:
      if (iVar15 != 0) {
        if (bVar7) goto LAB_002119da;
        goto LAB_002119bf;
      }
      if (bVar7) goto LAB_002119da;
      iVar15 = 0;
      break;
    }
    s = pbVar19 + lVar17;
    _Var8 = prefix_i((char *)s,"value");
    if (_Var8) {
      pcVar12 = strchr((char *)s,0x29);
      if (pcVar12 == (char *)0x0) {
        sVar13 = strlen((char *)s);
        iVar9 = (int)sVar13;
      }
      else {
        iVar9 = (((int)pcVar12 - (int)pbVar19) - (int)lVar17) + 1;
      }
      strncpy(local_438,(char *)s,(long)iVar9);
      local_438[iVar9] = '\0';
      pcVar12 = string_make(local_438);
      sVar13 = strlen(pcVar12);
      p = parse_value(pcVar12,full_line);
      if (p == (value_sec *)0x0) {
        bVar7 = true;
      }
      mem_free(pcVar12);
      if (bVar7) {
        mem_free(p);
        goto LAB_00211888;
      }
      if (f->max_depth < iVar15) {
        f->max_depth = iVar15;
      }
      pbVar10 = f->token_array;
      ptVar14 = new_token(TOK_VALUE,p,iVar15,not);
      borg_array_add(pbVar10,ptVar14);
      not = false;
      pbVar19 = s + sVar13;
      goto LAB_002114f8;
    }
    bVar2 = *s;
    if (bVar2 == 0x29) {
      iVar9 = -1;
      if (iVar15 < 1) goto LAB_002119bf;
LAB_002117a6:
      iVar15 = iVar15 + iVar9;
      pbVar19 = pbVar19 + lVar17 + 1;
      goto LAB_002114f8;
    }
    if (bVar2 == 0x28) {
      iVar9 = 1;
      goto LAB_002117a6;
    }
    if (bVar2 == 0x21) {
      not = true;
      pbVar19 = pbVar19 + lVar17 + 1;
      goto LAB_002114f8;
    }
    ppuVar11 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar11 + (long)(char)bVar2 * 2 + 1) & 8) == 0) {
      if (bVar2 - 0x2a < 6) {
        pbVar18 = pbVar19 + lVar17 + 1;
        switch((uint)bVar2) {
        case 0x2a:
          ttype = TOK_MULT;
          goto LAB_002117fb;
        case 0x2b:
          ttype = TOK_PLUS;
          goto LAB_002117fb;
        case 0x2d:
          if ((*(byte *)((long)*ppuVar11 + (long)(char)pbVar19[lVar17 + 1] * 2 + 1) & 8) != 0)
          goto LAB_0021165e;
          ttype = TOK_MINUS;
          goto LAB_002117fb;
        case 0x2f:
          ttype = TOK_DIV;
          goto LAB_002117fb;
        }
      }
      _Var8 = prefix_i((char *)s,"and");
      if (_Var8) {
        pbVar18 = pbVar19 + lVar17 + 3;
LAB_002117cd:
        ttype = TOK_AND;
        goto LAB_002117fb;
      }
      _Var8 = prefix_i((char *)s,"&&");
      pbVar18 = pbVar19 + lVar17 + 2;
      if (_Var8) goto LAB_002117cd;
      _Var8 = prefix_i((char *)s,"or");
      if ((_Var8) || (_Var8 = prefix_i((char *)s,"||"), _Var8)) {
        ttype = TOK_OR;
        goto LAB_002117fb;
      }
      bVar2 = *s;
      lVar17 = lVar17 + 1;
      if (bVar2 == 0x3c) {
        bVar22 = pbVar19[lVar17] == 0x3d;
        pbVar18 = pbVar19 + lVar17;
        if (bVar22) {
          pbVar18 = pbVar19 + lVar17 + 1;
        }
        ttype = (uint)bVar22 * 2 + TOK_LT;
        goto LAB_002117fb;
      }
      if (bVar2 == 0x3d) {
        pbVar18 = pbVar19 + lVar17;
        ttype = TOK_EQUALS;
        goto LAB_002117fb;
      }
      pbVar20 = pbVar20 + 1;
      if (bVar2 == 0x3e) goto LAB_002117d1;
      goto LAB_002114ff;
    }
LAB_0021165e:
    token = (undefined4 *)mem_alloc(4);
    lVar17 = atol((char *)s);
    *token = (int)lVar17;
    if (f->max_depth < iVar15) {
      f->max_depth = iVar15;
    }
    pbVar10 = f->token_array;
    ptVar14 = new_token(TOK_NUMBER,token,iVar15,not);
    borg_array_add(pbVar10,ptVar14);
    do {
      do {
        pbVar19 = pbVar20 + 1;
        pbVar20 = pbVar20 + 1;
      } while ((long)(char)*pbVar19 == 0x2d);
    } while (((*ppuVar11)[(char)*pbVar19] & 0x800) != 0);
    not = false;
    pbVar19 = pbVar20;
  } while( true );
LAB_002118ab:
  if (f->max_depth < iVar15) goto LAB_0021190d;
  uVar21 = 0;
  uVar16 = 0xffffffff;
  while( true ) {
    iVar9 = (int)uVar16;
    if ((long)f->token_array->count <= (long)uVar21) break;
    iVar3 = *(int *)((long)f->token_array->items[uVar21] + 0x10);
    if (iVar9 == -1) {
      uVar16 = uVar21 & 0xffffffff;
      if (iVar3 != iVar15) goto LAB_002118ed;
    }
    else if (iVar3 < iVar15) {
      adjust_order_ops_depth_block(f,iVar15,iVar9,(int)uVar21 + -1);
LAB_002118ed:
      uVar16 = 0xffffffff;
    }
    uVar21 = uVar21 + 1;
  }
  if (iVar9 != -1) {
    adjust_order_ops_depth_block(f,iVar15,iVar9,(int)uVar21 + -1);
  }
  iVar15 = iVar15 + 1;
  goto LAB_002118ab;
LAB_002117d1:
  bVar22 = pbVar19[lVar17] == 0x3d;
  pbVar18 = pbVar19 + lVar17;
  if (bVar22) {
    pbVar18 = pbVar19 + lVar17 + 1;
  }
  ttype = (uint)bVar22 * 2 + TOK_GT;
LAB_002117fb:
  if (f->max_depth < iVar15) {
    f->max_depth = iVar15;
  }
  pbVar10 = f->token_array;
  ptVar14 = new_token(ttype,(void *)0x0,iVar15,false);
  borg_array_add(pbVar10,ptVar14);
  pbVar19 = pbVar18;
  if (not) {
    borg_formula_error(line,full_line,"calculation","** not (!) can only be applied to values");
    bVar7 = true;
  }
  goto LAB_002114f8;
LAB_0021190d:
  uVar4 = f->token_array->count;
  if ((long)(int)uVar4 == 0) {
    local_450 = "** formula must contain values";
  }
  else {
    uVar16 = 0;
    uVar21 = 0;
    if (0 < (int)uVar4) {
      uVar21 = (ulong)uVar4;
    }
    ppvVar5 = f->token_array->items;
    local_450 = "** formula must be values separated by operators";
    do {
      if (uVar21 == uVar16) {
        if (*ppvVar5[(long)(int)uVar4 + -1] < 3) {
          iVar15 = borg_array_add(&calculations,f);
          if (iVar15 == -1) {
            borg_formula_error(line,full_line,"calculation","** can\'t add to formula array");
            return -1;
          }
          return iVar15;
        }
        local_450 = "** formula can\'t end in an operation";
        break;
      }
      ppvVar1 = ppvVar5 + uVar16;
      uVar6 = uVar16 & 1;
      uVar16 = uVar16 + 1;
    } while (2 < **ppvVar1 != (uVar6 == 0));
  }
LAB_002119bf:
  borg_formula_error(line,full_line,"calculation",local_450);
LAB_002119da:
  calc_free(f);
  return -1;
}

Assistant:

int parse_calculation_line(char *line, const char *full_line)
{
    struct borg_calculation *f = mem_zalloc(sizeof(struct borg_calculation));
    if (parse_calculation(f, line, full_line)) {
        calc_free(f);
        f = NULL;
        return -1;
    }

    int i = borg_array_add(&calculations, f);
    if (i == -1)
        borg_formula_error(
            line, full_line, "calculation", "** can't add to formula array");
    return i;
}